

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void do_gold(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  char buf [4608];
  char acStack_1228 [4616];
  
  bVar1 = is_number(argument);
  if (bVar1) {
    iVar2 = get_trust(ch);
    if (iVar2 == 0x3c) {
      iVar2 = atoi(argument);
      gold_constant = (long)iVar2;
      total_gold = num_pfiles * gold_constant;
      act("Global gold constant rate is now set to $t.",ch,argument,(void *)0x0,3);
      return;
    }
  }
  act("Riftshadow Gold System",ch,(void *)0x0,(void *)0x0,3);
  act("----------------------",ch,(void *)0x0,(void *)0x0,3);
  sprintf(acStack_1228,"Total gold in world  : %ld (%d players)\n\r",total_gold,
          (ulong)(uint)num_pfiles);
  send_to_char(acStack_1228,ch);
  sprintf(acStack_1228,"Gold held by players : %ld (%ldgp mobile held)\n\r",player_gold,
          total_gold - player_gold);
  send_to_char(acStack_1228,ch);
  if (total_gold < 1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = (double)(((float)(player_gold / total_gold) * 3.0 + 1.0) * 100.0);
  }
  sprintf(acStack_1228,"Global inflation rate: %.1f%% (gold constant %ld)\n\r",dVar3,gold_constant);
  send_to_char(acStack_1228,ch);
  return;
}

Assistant:

void do_gold(CHAR_DATA *ch, char *argument)
{
	char buf[MSL];
	float gc;

	if (is_number(argument) && get_trust(ch) == MAX_LEVEL)
	{
		gold_constant = atoi(argument);
		total_gold = num_pfiles * gold_constant;
		act("Global gold constant rate is now set to $t.", ch, argument, 0, TO_CHAR);
		return;
	}

	act("Riftshadow Gold System", ch, 0, 0, TO_CHAR);
	act("----------------------", ch, 0, 0, TO_CHAR);

	sprintf(buf, "Total gold in world  : %ld (%d players)\n\r", total_gold, num_pfiles);
	send_to_char(buf, ch);

	sprintf(buf, "Gold held by players : %ld (%ldgp mobile held)\n\r", player_gold, total_gold - player_gold);
	send_to_char(buf, ch);

	if (total_gold > 0)
		gc = (1.00f + 3.00f * (player_gold / total_gold)) * 100.00f;
	else
		gc = 0.00f;

	sprintf(buf, "Global inflation rate: %.1f%% (gold constant %ld)\n\r", gc, gold_constant);
	send_to_char(buf, ch);
}